

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

errr run_parse_ui_entry(parser *p)

{
  ui_entry **ppuVar1;
  errr eVar2;
  wchar_t wVar3;
  long lVar4;
  long lVar5;
  
  eVar2 = parse_file(p,"ui_entry_base");
  if (eVar2 == 0) {
    wVar3 = hatch_last_embryo(p);
    ppuVar1 = entries;
    eVar2 = 1;
    if (wVar3 == L'\0') {
      lVar4 = (long)n_entry;
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          ppuVar1[lVar5]->flags = ppuVar1[lVar5]->flags | 0x100000;
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      eVar2 = parse_file(p,"ui_entry");
      return eVar2;
    }
  }
  return eVar2;
}

Assistant:

static errr run_parse_ui_entry(struct parser *p)
{
	errr result = parse_file(p, "ui_entry_base");
	int i;

	if (result != 0) {
		return result;
	}
	if (hatch_last_embryo(p)) {
		return 1;
	}
	/*
	 * Mark those as templates only so they'll never be directly displayed.
	 */
	for (i = 0; i < n_entry; ++i) {
		entries[i]->flags |= ENTRY_FLAG_TEMPLATE_ONLY;
	}
	return parse_file(p, "ui_entry");
}